

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::form::add(form *this,form *subform)

{
  pointer *pppVar1;
  iterator __position;
  pair<cppcms::base_form_*,_bool> local_20;
  
  local_20._8_4_ = local_20._8_4_ & 0xffffff00;
  __position._M_current =
       (this->elements_).
       super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_20.first = &subform->super_base_form;
  if (__position._M_current ==
      (this->elements_).
      super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::pair<cppcms::base_form*,bool>,std::allocator<std::pair<cppcms::base_form*,bool>>>::
    _M_realloc_insert<std::pair<cppcms::base_form*,bool>>
              ((vector<std::pair<cppcms::base_form*,bool>,std::allocator<std::pair<cppcms::base_form*,bool>>>
                *)&this->elements_,__position,&local_20);
  }
  else {
    (__position._M_current)->first = &subform->super_base_form;
    (__position._M_current)->second = local_20.second;
    *(undefined3 *)&(__position._M_current)->field_0x9 = local_20._9_3_;
    *(undefined4 *)&(__position._M_current)->field_0xc = local_20._12_4_;
    pppVar1 = &(this->elements_).
               super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  (*(subform->super_base_form)._vptr_base_form[4])(subform,this);
  return;
}

Assistant:

void form::add(form &subform)
{
	elements_.push_back(widget_type(&subform,false));
	subform.parent(this);
}